

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O1

DynamicStaleResourceWrapper __thiscall
Diligent::DynamicStaleResourceWrapper::
Create<VulkanUtilities::VulkanObjectWrapper<VkImageView_T*,(VulkanUtilities::VulkanHandleTypeId)5>,void>
          (DynamicStaleResourceWrapper *this,
          VulkanObjectWrapper<VkImageView_T_*,_(VulkanUtilities::VulkanHandleTypeId)5> *Resource,
          RefCounterType NumReferences)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  StaleResourceBase *pSVar2;
  char (*in_RCX) [19];
  string msg;
  string local_40;
  
  if (NumReferences < 1) {
    FormatString<char[26],char[19]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumReferences >= 1",in_RCX);
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0x48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (NumReferences == 1) {
    pSVar2 = (StaleResourceBase *)operator_new(0x20);
    pSVar2->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificStaleResource_00939320;
    pSVar2[1]._vptr_StaleResourceBase =
         (_func_int **)
         (Resource->m_pLogicalDevice).
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    pSVar2[2]._vptr_StaleResourceBase = (_func_int **)0x0;
    p_Var1 = (Resource->m_pLogicalDevice).
             super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (Resource->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar2[2]._vptr_StaleResourceBase = (_func_int **)p_Var1;
    (Resource->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    pSVar2[3]._vptr_StaleResourceBase = (_func_int **)Resource->m_VkObject;
    Resource->m_VkObject = (VkImageView_T *)0x0;
  }
  else {
    pSVar2 = (StaleResourceBase *)operator_new(0x28);
    pSVar2->_vptr_StaleResourceBase = (_func_int **)&PTR__SpecificSharedStaleResource_00939360;
    pSVar2[1]._vptr_StaleResourceBase =
         (_func_int **)
         (Resource->m_pLogicalDevice).
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    pSVar2[2]._vptr_StaleResourceBase = (_func_int **)0x0;
    p_Var1 = (Resource->m_pLogicalDevice).
             super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (Resource->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pSVar2[2]._vptr_StaleResourceBase = (_func_int **)p_Var1;
    (Resource->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    pSVar2[3]._vptr_StaleResourceBase = (_func_int **)Resource->m_VkObject;
    Resource->m_VkObject = (VkImageView_T *)0x0;
    pSVar2[4]._vptr_StaleResourceBase = (_func_int **)NumReferences;
  }
  this->m_pStaleResource = pSVar2;
  return (DynamicStaleResourceWrapper)(StaleResourceBase *)this;
}

Assistant:

static DynamicStaleResourceWrapper Create(ResourceType&& Resource, RefCounterType NumReferences)
    {
        VERIFY_EXPR(NumReferences >= 1);

        class SpecificStaleResource final : public StaleResourceBase
        {
        public:
            SpecificStaleResource(ResourceType&& SpecificResource) :
                m_SpecificResource(std::move(SpecificResource))
            {}

            // clang-format off
            SpecificStaleResource             (const SpecificStaleResource&) = delete;
            SpecificStaleResource             (SpecificStaleResource&&)      = delete;
            SpecificStaleResource& operator = (const SpecificStaleResource&) = delete;
            SpecificStaleResource& operator = (SpecificStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                delete this;
            }

        private:
            ResourceType m_SpecificResource;
        };

        class SpecificSharedStaleResource final : public StaleResourceBase
        {
        public:
            SpecificSharedStaleResource(ResourceType&& SpecificResource, RefCounterType NumReferences) :
                m_SpecificResource(std::move(SpecificResource)),
                m_RefCounter{NumReferences}
            {
            }

            // clang-format off
            SpecificSharedStaleResource             (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource             (SpecificSharedStaleResource&&)      = delete;
            SpecificSharedStaleResource& operator = (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource& operator = (SpecificSharedStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                if (m_RefCounter.fetch_add(-1) - 1 == 0)
                {
                    delete this;
                }
            }

        private:
            ResourceType                m_SpecificResource;
            std::atomic<RefCounterType> m_RefCounter;
        };

        return DynamicStaleResourceWrapper{
            NumReferences == 1 ?
                static_cast<StaleResourceBase*>(new SpecificStaleResource{std::move(Resource)}) :
                static_cast<StaleResourceBase*>(new SpecificSharedStaleResource{std::move(Resource), NumReferences})};
    }